

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  undefined4 uVar1;
  ulong uVar2;
  U32 maxDist_00;
  U32 UVar3;
  uint uVar4;
  void *pvVar5;
  size_t sVar6;
  long lVar7;
  void *in_RCX;
  long in_RDX;
  long *in_RSI;
  ZSTD_window_t *in_RDI;
  ulong in_R8;
  bool bVar8;
  U32 correction;
  U32 ldmHSize;
  size_t prevSize;
  size_t newLeftoverSize;
  size_t chunkSize;
  BYTE *chunkEnd;
  size_t remaining;
  BYTE *chunkStart;
  size_t leftoverSize;
  size_t chunk;
  size_t nbChunks;
  size_t kMaxChunkSize;
  BYTE *iend;
  BYTE *istart;
  U32 maxDist;
  size_t in_stack_00000118;
  void *in_stack_00000120;
  ldmParams_t *in_stack_00000128;
  rawSeqStore_t *in_stack_00000130;
  ldmState_t *in_stack_00000138;
  void *local_b0;
  size_t local_68;
  ulong local_60;
  
  maxDist_00 = 1 << ((byte)*(undefined4 *)(in_RDX + 0x14) & 0x1f);
  local_68 = 0;
  local_60 = 0;
  while( true ) {
    bVar8 = false;
    if (local_60 < (in_R8 >> 0x14) + (long)(int)(uint)((in_R8 & 0xfffff) != 0)) {
      bVar8 = (ulong)in_RSI[2] < (ulong)in_RSI[3];
    }
    if (!bVar8) {
      return 0;
    }
    pvVar5 = (void *)((long)in_RCX + local_60 * 0x100000);
    local_b0 = (void *)((long)in_RCX + in_R8);
    if (0xfffff < (ulong)((long)((long)in_RCX + in_R8) - (long)pvVar5)) {
      local_b0 = (void *)((long)pvVar5 + 0x100000);
    }
    uVar2 = in_RSI[2];
    UVar3 = ZSTD_window_needOverflowCorrection(*in_RDI,local_b0);
    if (UVar3 != 0) {
      uVar1 = *(undefined4 *)(in_RDX + 4);
      UVar3 = ZSTD_window_correctOverflow(in_RDI,0,maxDist_00,in_RCX);
      ZSTD_ldm_reduceTable((ldmEntry_t *)in_RDI[1].nextSrc,1 << ((byte)uVar1 & 0x1f),UVar3);
    }
    ZSTD_window_enforceMaxDist(in_RDI,local_b0,maxDist_00,(U32 *)0x0);
    sVar6 = ZSTD_ldm_generateSequences_internal
                      (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120,
                       in_stack_00000118);
    uVar4 = ZSTD_isError(0x2b3507);
    if (uVar4 != 0) break;
    if (uVar2 < (ulong)in_RSI[2]) {
      lVar7 = *in_RSI + uVar2 * 0xc;
      *(int *)(lVar7 + 4) = (int)local_68 + *(int *)(lVar7 + 4);
      local_68 = sVar6;
    }
    else {
      local_68 = (long)local_b0 + (local_68 - (long)pvVar5);
    }
    local_60 = local_60 + 1;
  }
  return sVar6;
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximmum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, src);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         the offset against maxDist directly.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}